

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
GdlSetAttrItem::DebugXmlRhs
          (GdlSetAttrItem *this,GrcManager *pcman,ofstream *strmOut,string *staPathToCur)

{
  pointer ppGVar1;
  GdlAttrValueSpec *this_00;
  string sVar2;
  bool bVar3;
  ostream *poVar4;
  uint uVar5;
  char *pcVar6;
  undefined1 in_stack_ffffffffffffff90 [24];
  string local_50 [32];
  
  poVar4 = std::operator<<((ostream *)strmOut,"          <rhsSlot className=\"");
  GrcSymbolTableEntry::FullAbbrev_abi_cxx11_
            ((string *)&stack0xffffffffffffff90,(this->super_GdlRuleItem).m_psymInput);
  std::operator<<(poVar4,(string *)&stack0xffffffffffffff90);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  if ((this->m_vpavs).super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->m_vpavs).super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    std::operator<<((ostream *)strmOut,"\" assignmentGdl=\"");
    (*(this->super_GdlRuleItem)._vptr_GdlRuleItem[0x27])(this,pcman,0,0,strmOut,1);
  }
  poVar4 = std::operator<<((ostream *)strmOut,"\" slotIndex=\"");
  poVar4 = (ostream *)
           std::ostream::operator<<(poVar4,(this->super_GdlRuleItem).m_iritContextPos + 1);
  std::operator<<(poVar4,"\"");
  uVar5 = 0;
  pcVar6 = "/>\n";
  do {
    ppGVar1 = (this->m_vpavs).
              super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_vpavs).
                      super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3) <=
        (ulong)uVar5) goto LAB_001160a5;
    bVar3 = GrcSymbolTableEntry::IsAttachment(ppGVar1[uVar5]->m_psymName);
    uVar5 = uVar5 + 1;
  } while (!bVar3);
  std::operator<<((ostream *)strmOut,">\n            <slotAttrs");
  uVar5 = 0;
  while( true ) {
    ppGVar1 = (this->m_vpavs).
              super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_vpavs).
                      super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3) <=
        (ulong)uVar5) break;
    this_00 = ppGVar1[uVar5];
    std::__cxx11::string::string(local_50,(string *)staPathToCur);
    sVar2._M_string_length = in_stack_ffffffffffffff90._0_8_;
    sVar2.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )in_stack_ffffffffffffff90._8_16_;
    sVar2._M_dataplus._M_p = (pointer)staPathToCur;
    GdlAttrValueSpec::DebugXml(this_00,pcman,(ostream *)strmOut,sVar2);
    std::__cxx11::string::~string(local_50);
    uVar5 = uVar5 + 1;
  }
  pcVar6 = " />\n          </rhsSlot>\n";
LAB_001160a5:
  std::operator<<((ostream *)strmOut,pcVar6);
  return;
}

Assistant:

void GdlSetAttrItem::DebugXmlRhs(GrcManager * pcman, std::ofstream & strmOut,
	std::string staPathToCur)
{
	strmOut << "          <rhsSlot className=\"" << m_psymInput->FullAbbrev();
	if (m_vpavs.size() > 0)
	{
		strmOut << "\" assignmentGdl=\"";
		AttrSetterPrettyPrint(pcman, NULL, 0, strmOut, true);	// NULL and 0 are bogus but not used
	}

	strmOut << "\" slotIndex=\"" << m_iritContextPos + 1 << "\"";

	bool fNeedSlotAttrs = false;
	for (unsigned ipavs = 0; ipavs < m_vpavs.size(); ipavs++)
	{
		// For now, we only need attachment slot attributes.
		if (m_vpavs[ipavs]->m_psymName->IsAttachment())
		{
			fNeedSlotAttrs = true;
			break;
		}
	}
	if (fNeedSlotAttrs)
	{
		strmOut << ">\n            <slotAttrs";
		for (unsigned ipavs = 0; ipavs < m_vpavs.size(); ipavs++)
		{
			m_vpavs[ipavs]->DebugXml(pcman, strmOut, staPathToCur);
		}
		strmOut << " />\n          </rhsSlot>\n";
	}
	else
	{
		strmOut << "/>\n";
	}
}